

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrUtil.c
# Opt level: O1

void Pdr_SetPrint(FILE *pFile,Pdr_Set_t *p,int nRegs,Vec_Int_t *vFlopCounts)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  int iVar4;
  char *__s;
  ulong uVar5;
  long lVar6;
  
  __s = (char *)malloc((long)(nRegs + 1));
  if (nRegs < 1) {
    uVar5 = 0;
  }
  else {
    uVar5 = (ulong)(uint)nRegs;
    memset(__s,0x2d,uVar5);
  }
  __s[uVar5] = '\0';
  iVar1 = p->nLits;
  if (0 < (long)iVar1) {
    lVar6 = 0;
    do {
      uVar2 = *(uint *)(&p->field_0x14 + lVar6 * 4);
      if (uVar2 != 0xffffffff) {
        if ((int)uVar2 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x130,"int Abc_LitIsCompl(int)");
        }
        __s[uVar2 >> 1] = (byte)uVar2 & 1 ^ 0x31;
      }
      lVar6 = lVar6 + 1;
    } while (iVar1 != lVar6);
  }
  if (vFlopCounts != (Vec_Int_t *)0x0) {
    iVar1 = vFlopCounts->nSize;
    uVar5 = 0;
    if (0 < (long)iVar1) {
      piVar3 = vFlopCounts->pArray;
      lVar6 = 0;
      do {
        if (piVar3[lVar6] != 0) {
          iVar4 = (int)uVar5;
          uVar5 = (ulong)(iVar4 + 1);
          __s[iVar4] = __s[lVar6];
        }
        lVar6 = lVar6 + 1;
      } while (iVar1 != lVar6);
      uVar5 = (ulong)(int)uVar5;
    }
    __s[uVar5] = '\0';
  }
  fputs(__s,(FILE *)pFile);
  if (__s != (char *)0x0) {
    free(__s);
    return;
  }
  return;
}

Assistant:

void Pdr_SetPrint( FILE * pFile, Pdr_Set_t * p, int nRegs, Vec_Int_t * vFlopCounts )
{
    char * pBuff;
    int i, k, Entry;
    pBuff = ABC_ALLOC( char, nRegs + 1 );
    for ( i = 0; i < nRegs; i++ )
        pBuff[i] = '-';
    pBuff[i] = 0;
    for ( i = 0; i < p->nLits; i++ )
    {
        if ( p->Lits[i] == -1 )
            continue;
        pBuff[Abc_Lit2Var(p->Lits[i])] = (Abc_LitIsCompl(p->Lits[i])? '0':'1');
    }
    if ( vFlopCounts )
    {
        // skip some literals
        k = 0;
        Vec_IntForEachEntry( vFlopCounts, Entry, i )
            if ( Entry ) 
                pBuff[k++] = pBuff[i];
        pBuff[k] = 0;
    }
    fprintf( pFile, "%s", pBuff );
    ABC_FREE( pBuff );
}